

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_long>
          (detail *this,appender out,write_int_arg<unsigned_long> arg,
          basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> it_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  appender aVar5;
  uint uVar6;
  basic_format_specs<char> *specs_00;
  appender it;
  undefined1 auStack_80 [8];
  write_int_data<char> data;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_48;
  anon_class_16_3_9e397504_for_write_digits local_40;
  
  specs_00 = arg._8_8_;
  pVar1 = specs_00->type;
  uVar4 = (uint)arg.abs_value;
  local_40.abs_value._5_3_ =
       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._5_3_;
  local_40.abs_value._0_5_ =
       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_5_;
  local_48.container = (buffer<char> *)this;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) == 0) ||
       (bVar2 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                          ((appender *)&local_48,
                           (unsigned_long)
                           out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                           uVar4,specs_00,(locale_ref)specs), !bVar2)) {
      local_40.num_digits =
           do_count_digits((uint64_t)
                           out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
      ;
      it_00.container = local_48.container;
      if (specs_00->precision == -1 && specs_00->width == 0) {
        if (uVar4 != 0) {
          for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            data.padding._0_1_ = (char)uVar4;
            buffer<char>::push_back(it_00.container,(char *)&data.padding);
          }
        }
        local_48.container =
             (buffer<char> *)
             write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1579:41)>
             ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                       ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_40,it_00.container);
      }
      else {
        write_int_data<char>::write_int_data
                  ((write_int_data<char> *)auStack_80,local_40.num_digits,uVar4,specs_00);
        data.padding._0_4_ = uVar4;
        local_48.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                       (it_00.container,specs_00,(size_t)auStack_80,
                        (anon_class_40_3_03e05ccd *)&data.padding);
      }
    }
    break;
  case oct:
    local_40.num_digits =
         count_digits<3,unsigned_long>
                   ((unsigned_long)
                    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container !=
        (buffer<char> *)0x0 && specs_00->precision <= local_40.num_digits)) {
      uVar3 = 0x3000;
      if (uVar4 == 0) {
        uVar3 = 0x30;
      }
      uVar4 = (uVar3 | uVar4) + 0x1000000;
    }
    if (specs_00->precision == -1 && specs_00->width == 0) {
      if (uVar4 != 0) {
        for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          data.padding._0_1_ = (char)uVar4;
          buffer<char>::push_back((buffer<char> *)this,(char *)&data.padding);
        }
      }
      local_48.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1612:22)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_40,
                      (reserve_iterator<fmt::v8::appender>)this);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)auStack_80,local_40.num_digits,uVar4,specs_00);
      data.padding._0_4_ = uVar4;
      local_48.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                     ((appender)this,specs_00,(size_t)auStack_80,
                      (anon_class_40_3_03e05ccd *)&data.padding);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar6 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar3 = uVar6 << 8;
      if (uVar4 == 0) {
        uVar3 = uVar6;
      }
      uVar4 = (uVar3 | uVar4) + 0x2000000;
    }
    local_40.num_digits =
         count_digits<4,unsigned_long>
                   ((unsigned_long)
                    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    local_40._13_3_ = 0;
    local_40.upper = pVar1 == hex_upper;
    if (specs_00->precision == -1 && specs_00->width == 0) {
      if (uVar4 != 0) {
        for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          data.padding._0_1_ = (char)uVar4;
          buffer<char>::push_back((buffer<char> *)this,(char *)&data.padding);
        }
      }
      local_48.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1590:41)>
           ::anon_class_40_3_03e05ccd::anon_class_16_3_9e397504_for_write_digits::operator()
                     (&local_40,(reserve_iterator<fmt::v8::appender>)this);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)auStack_80,local_40.num_digits,uVar4,specs_00);
      data.padding._0_4_ = uVar4;
      local_48.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                     ((appender)this,specs_00,(size_t)auStack_80,
                      (anon_class_40_3_03e05ccd_conflict *)&data.padding);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar6 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar3 = uVar6 << 8;
      if (uVar4 == 0) {
        uVar3 = uVar6;
      }
      uVar4 = (uVar3 | uVar4) + 0x2000000;
    }
    local_40.num_digits =
         count_digits<1,unsigned_long>
                   ((unsigned_long)
                    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    if (specs_00->precision == -1 && specs_00->width == 0) {
      if (uVar4 != 0) {
        for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          data.padding._0_1_ = (char)uVar4;
          buffer<char>::push_back((buffer<char> *)this,(char *)&data.padding);
        }
      }
      local_48.container =
           (buffer<char> *)
           write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/spdlog/include/spdlog/fmt/bundled/format.h:1601:22)>
           ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                     ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_40,
                      (reserve_iterator<fmt::v8::appender>)this);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)auStack_80,local_40.num_digits,uVar4,specs_00);
      data.padding._0_4_ = uVar4;
      local_48.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                     ((appender)this,specs_00,(size_t)auStack_80,
                      (anon_class_40_3_03e05ccd *)&data.padding);
    }
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    aVar5 = write_char<char,fmt::v8::appender>
                      ((appender)this,
                       (char)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                             container,specs_00);
    return (appender)aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  return (appender)local_48.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}